

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>,_void>
     ::serialize<OutputStream>
               (vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                *s,OutputStream *ostream)

{
  ulong uVar1;
  
  uVar1 = ((long)(s->
                 super__Vector_base<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(s->
                super__Vector_base<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x50;
  TrivialSerializer<unsigned_int>::serialize<OutputStream>((uint)uVar1,ostream);
  serialize_elems<OutputStream>(s,uVar1 & 0xffffffff,ostream);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }